

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

Color * __thiscall Sphere::getTextureColor(Color *__return_storage_ptr__,Sphere *this,Vector3 *p)

{
  Material *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector3 n;
  Vector3 local_60;
  Vector3 local_48;
  
  pMVar1 = (this->super_Object).m_material;
  if (pMVar1->m_texture_func == (_func_Color_double_double *)0x0 && pMVar1->m_texture == (Bmp *)0x0)
  {
    __return_storage_ptr__->r = 1.0;
    __return_storage_ptr__->g = 1.0;
    __return_storage_ptr__->b = 1.0;
  }
  else {
    operator-(p,&this->m_o);
    Vector3::unitize(&local_48,&local_60);
    dVar2 = Vector3::dot(&local_48,&this->m_dz);
    dVar3 = acos(dVar2);
    dVar4 = Vector3::dot(&local_48,&this->m_dx);
    dVar5 = sin(dVar3);
    dVar2 = -1.0;
    if (-1.0 <= dVar4 / dVar5) {
      dVar2 = dVar4 / dVar5;
    }
    dVar4 = 1.0;
    if (dVar2 <= 1.0) {
      dVar4 = dVar2;
    }
    dVar2 = acos(dVar4);
    dVar3 = dVar3 / Const::PI;
    dVar2 = (dVar2 * 0.5) / Const::PI;
    operator*(&this->m_dz,&this->m_dx);
    dVar4 = Vector3::dot(&local_48,&local_60);
    Material::getTextureColor
              (__return_storage_ptr__,(this->super_Object).m_material,
               (double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar2 |
                       (ulong)(1.0 - dVar2) & -(ulong)(dVar4 < 0.0)),dVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Sphere::getTextureColor(const Vector3& p) const
{
    if (m_material->hasTexture())
    {
        Vector3 n = (p - m_o).unitize();
        double b = acos(n.dot(m_dz)), a = acos(std::min(std::max(n.dot(m_dx) / sin(b), -1.0), 1.0));
        double v = b / Const::PI, u = a / 2 / Const::PI;
        if (n.dot(m_dz * m_dx) < 0) u = 1 - u;
        return m_material->getTextureColor(u, v);
    }
    else
        return Color(1, 1, 1);
}